

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_map_l2neigh_data(oonf_layer2_data *data,dlep_session *session,dlep_extension *ext)

{
  oonf_layer2_neighbor_index oVar1;
  _func_int_oonf_layer2_data_ptr_oonf_layer2_metadata_ptr_dlep_session_ptr_uint16_t_uint64_t *p_Var2
  ;
  int iVar3;
  dlep_neighbor_mapping *pdVar4;
  oonf_layer2_metadata *poVar5;
  ulong local_38;
  size_t i;
  dlep_neighbor_mapping *map;
  dlep_extension *ext_local;
  dlep_session *session_local;
  oonf_layer2_data *data_local;
  
  local_38 = 0;
  while( true ) {
    if (ext->neigh_mapping_count <= local_38) {
      return 0;
    }
    pdVar4 = ext->neigh_mapping + local_38;
    p_Var2 = pdVar4->from_tlv;
    oVar1 = pdVar4->layer2;
    poVar5 = oonf_layer2_neigh_metadata_get(pdVar4->layer2);
    iVar3 = (*p_Var2)(data + oVar1,poVar5,session,pdVar4->dlep,pdVar4->scaling);
    if (iVar3 != 0) break;
    local_38 = local_38 + 1;
  }
  return -((int)local_38 + 1);
}

Assistant:

int
dlep_reader_map_l2neigh_data(struct oonf_layer2_data *data, struct dlep_session *session,
    struct dlep_extension *ext) {
  struct dlep_neighbor_mapping *map;
  size_t i;

  for (i = 0; i < ext->neigh_mapping_count; i++) {
    map = &ext->neigh_mapping[i];

    if (map->from_tlv(&data[map->layer2], oonf_layer2_neigh_metadata_get(map->layer2), session,
        map->dlep, map->scaling)) {
      return -(i + 1);
    }
  }
  return 0;
}